

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitPow(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,BinaryExpr e)

{
  Expr e_00;
  Expr e_01;
  Parameters prm;
  bool bVar1;
  int iVar2;
  Impl *in_RDX;
  EExpr *in_RDI;
  double dVar3;
  EExpr *in_stack_00000118;
  EExpr er;
  EExpr el;
  EExpr *in_stack_fffffffffffffb38;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffb40;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *pPVar4;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  ExprBase in_stack_fffffffffffffb50;
  int *piVar5;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
  *in_stack_fffffffffffffb60;
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
  *fc;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffb68;
  undefined8 local_458 [7];
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffbe0;
  undefined1 local_404 [60];
  undefined4 local_3c8;
  ExprBase local_3b8;
  AlgebraicExpression<mp::QuadAndLinTerms> local_3a8;
  ExprBase local_1e8;
  ExprBase local_10;
  
  local_10.impl_ = in_RDX;
  local_1e8.impl_ =
       (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
               ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                      *)in_stack_fffffffffffffb38);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffb50.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  e_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb4c;
  e_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb48;
  Convert2EExpr(in_stack_fffffffffffffb40,e_00);
  local_3b8.impl_ =
       (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
               ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                      *)in_stack_fffffffffffffb38);
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffb50.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffb40 >> 0x20));
  e_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffb4c;
  e_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffb48;
  Convert2EExpr(in_stack_fffffffffffffb40,e_01);
  bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x61af84);
  if (bVar1) {
    dVar3 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(&local_3a8);
    if (((dVar3 != 2.0) || (NAN(dVar3))) ||
       (bVar1 = IfQuadratizePow2((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                                  *)0x61afb7), !bVar1)) {
      pPVar4 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)local_404;
      iVar2 = Convert2Var(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      *(int *)&(pPVar4->
               super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
               ).
               super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
               .
               super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
               ._vptr_BasicExprVisitor = iVar2;
      AlgebraicExpression<mp::QuadAndLinTerms>::constant_term(&local_3a8);
      fc = (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
            *)(local_404 + 4);
      prm._M_elems[0]._4_4_ = in_stack_fffffffffffffb5c;
      prm._M_elems[0]._0_4_ = in_stack_fffffffffffffb58;
      CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
      ::CustomFunctionalConstraint
                ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                  *)in_stack_fffffffffffffb50.impl_,(_Type)(int)((ulong)fc >> 0x20),prm);
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::
      AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::PowConstExpId>>
                (pPVar4,fc);
      CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
      ::~CustomFunctionalConstraint
                ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>
                  *)0x61b0b0);
    }
    else {
      QuadratizeOrLinearize
                ((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)er.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                    super_small_vector_base<std::allocator<double>,_6U>.m_data.
                    super_small_vector_data_base<double_*,_unsigned_long>.m_capacity,
                 (EExpr *)er.super_QuadraticExpr.super_QuadAndLinTerms.super_LinTerms.coefs_.
                          super_small_vector_base<std::allocator<double>,_6U>.m_data.
                          super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 in_stack_00000118);
    }
  }
  else {
    bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                      ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x61b0f3);
    if (bVar1) {
      VisitPowConstBase(in_stack_fffffffffffffbe0,(BinaryExpr)local_10.impl_);
    }
    else {
      piVar5 = (int *)local_458;
      iVar2 = Convert2Var(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      *piVar5 = iVar2;
      pPVar4 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *)(piVar5 + 1);
      iVar2 = Convert2Var(pPVar4,in_stack_fffffffffffffb38);
      *(int *)&(pPVar4->
               super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
               ).
               super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
               .
               super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
               ._vptr_BasicExprVisitor = iVar2;
      CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
      ::CustomFunctionalConstraint
                ((CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
                  *)(local_458 + 1),local_458[0]);
      ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
      ::
      AssignResult2Args<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>>
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
      ::~CustomFunctionalConstraint
                ((CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
                  *)0x61b1bd);
    }
  }
  local_3c8 = 1;
  EExpr::~EExpr((EExpr *)0x61b1f7);
  EExpr::~EExpr((EExpr *)0x61b204);
  return in_RDI;
}

Assistant:

EExpr VisitPow(BinaryExpr e) {
    auto el = Convert2EExpr(e.lhs());
    auto er = Convert2EExpr(e.rhs());
    if (er.is_constant()) {
      if (2.0==er.constant_term() &&
          IfQuadratizePow2()) {
        return QuadratizeOrLinearize(el, el);
      }
      return AssignResult2Args(
          PowConstExpConstraint(
              PowConstExpConstraint::Arguments{ Convert2Var(std::move(el)) },
              PowConstExpConstraint::Parameters{ er.constant_term() } ) );
    }
    else if (el.is_constant())
      return VisitPowConstBase(e);
    else
      return AssignResult2Args(
          PowConstraint(
              PowConstraint::Arguments{ {
                                        Convert2Var(std::move(el)),
                                        Convert2Var(std::move(er)) } },
              {} ) );
  }